

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

void __thiscall
duckdb::InvalidInputException::InvalidInputException<std::__cxx11::string>
          (InvalidInputException *this,string *msg,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  string sStack_58;
  string local_38;
  
  ::std::__cxx11::string::string((string *)&local_38,(string *)params);
  Exception::ConstructMessage<std::__cxx11::string>(&sStack_58,(Exception *)msg,&local_38,in_RCX);
  InvalidInputException(this,&sStack_58);
  ::std::__cxx11::string::~string((string *)&sStack_58);
  ::std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

explicit InvalidInputException(const string &msg, ARGS... params)
	    : InvalidInputException(ConstructMessage(msg, params...)) {
	}